

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O3

void load_keymap(void)

{
  int iVar1;
  wchar_t wVar2;
  bool bVar3;
  wchar_t wVar4;
  nh_bool nVar5;
  int iVar6;
  uint uVar7;
  void *__src;
  long lVar8;
  size_t sVar9;
  __off_t _Var10;
  char *__s;
  byte *pbVar11;
  ushort **ppuVar12;
  nh_cmd_desc *pnVar13;
  nh_cmd_desc *pnVar14;
  ulong uVar15;
  long lVar16;
  nh_cmd_desc **ppnVar17;
  byte bVar18;
  byte *cmdname;
  byte bVar19;
  char *endptr;
  fnchar filename [256];
  byte *local_140;
  char local_138 [8];
  undefined4 auStack_130 [64];
  
  __src = (void *)nh_get_commands(&cmdcount);
  lVar8 = (long)cmdcount;
  commandlist = (nh_cmd_desc *)malloc(lVar8 * 0x6c);
  memcpy(commandlist,__src,lVar8 * 0x6c);
  init_keymap();
  local_138[0] = '\0';
  nVar5 = get_gamedir(CONFIG_DIR,local_138);
  if (nVar5 != '\0') {
    sVar9 = strlen(local_138);
    builtin_strncpy(local_138 + sVar9,"keymap.c",8);
    *(undefined4 *)((long)auStack_130 + sVar9) = 0x666e6f;
    iVar6 = open(local_138,0,0);
    if (iVar6 != -1) {
      _Var10 = lseek(iVar6,0,2);
      lseek(iVar6,0,0);
      iVar1 = (int)_Var10;
      __s = (char *)malloc((long)(iVar1 + 1));
      read(iVar6,__s,(long)iVar1);
      __s[iVar1] = '\0';
      close(iVar6);
      unknown_count = L'\0';
      memset(unknown_keymap,0,0xff8);
      pbVar11 = (byte *)strtok(__s,"\r\n");
      while (pbVar11 != (byte *)0x0) {
        bVar19 = *pbVar11;
        if (bVar19 == 0) {
          uVar15 = 0;
        }
        else {
          ppuVar12 = __ctype_b_loc();
          uVar15 = 0;
          bVar18 = bVar19;
          do {
            if ((*(byte *)((long)*ppuVar12 + (ulong)bVar18 * 2 + 1) & 0x20) != 0) break;
            bVar18 = pbVar11[uVar15 + 1];
            uVar15 = uVar15 + 1;
          } while (bVar18 != 0);
          uVar15 = uVar15 & 0xffffffff;
          bVar18 = pbVar11[uVar15];
          while (bVar18 != 0) {
            if ((*(byte *)((long)*ppuVar12 + (ulong)bVar18 * 2 + 1) & 0x20) == 0) {
              cmdname = pbVar11 + uVar15;
              pnVar13 = find_command((char *)cmdname);
              if (pnVar13 != (nh_cmd_desc *)0x0) goto LAB_0010af7f;
              if (bVar18 == 0x2d) goto LAB_0010b0de;
              goto LAB_0010afa4;
            }
            lVar8 = uVar15 + 1;
            uVar15 = uVar15 + 1;
            bVar18 = pbVar11[lVar8];
          }
        }
        cmdname = pbVar11 + uVar15;
        pnVar13 = find_command((char *)cmdname);
        if (pnVar13 == (nh_cmd_desc *)0x0) {
LAB_0010afa4:
          wVar4 = unknown_count;
          pnVar13 = unknown_commands;
          lVar8 = (long)unknown_count;
          pnVar14 = unknown_commands;
          if (unknown_size <= unknown_count) {
            wVar2 = unknown_size * 2;
            if (unknown_size * 2 < L'\x11') {
              wVar2 = L'\x10';
            }
            unknown_size = wVar2;
            pnVar14 = (nh_cmd_desc *)realloc(unknown_commands,(ulong)(uint)wVar2 * 0x6c);
            unknown_commands = pnVar14;
            memset(pnVar14 + lVar8,0,(long)(wVar2 - wVar4) * 0x6c);
            lVar16 = 0;
            do {
              if (*(long *)((long)unknown_keymap + lVar16) != 0) {
                *(long *)((long)unknown_keymap + lVar16) =
                     (long)pnVar14 + (*(long *)((long)unknown_keymap + lVar16) - (long)pnVar13);
              }
              lVar16 = lVar16 + 8;
            } while (lVar16 != 0xff8);
          }
          unknown_count = wVar4 + L'\x01';
          pnVar13 = pnVar14 + lVar8;
          strncpy(pnVar13->name,(char *)cmdname,0x14);
          pnVar14[lVar8].name[0x13] = '\0';
          bVar19 = *pbVar11;
          bVar3 = false;
        }
        else {
LAB_0010af7f:
          bVar3 = true;
        }
        if (((bVar19 == 0x45) && (pbVar11[1] == 0x58)) && (pbVar11[2] == 0x54)) {
          pbVar11 = (byte *)((long)&pnVar13->flags + 1);
          *pbVar11 = *pbVar11 | 4;
        }
        else {
          iVar6 = strncmp((char *)pbVar11,"NOEXT",5);
          if (iVar6 == 0) {
            pbVar11 = (byte *)((long)&pnVar13->flags + 1);
            *pbVar11 = *pbVar11 & 0xfb;
          }
          else {
            lVar8 = strtol((char *)pbVar11,(char **)&local_140,0x10);
            uVar7 = (uint)lVar8;
            if ((uVar7 == 0) || (local_140 == pbVar11)) {
              curses_msgwin("Bad/damaged keymap.conf. Reverting to defaults.");
              init_keymap();
              return;
            }
            if (uVar7 < 0x1ff) {
              if (bVar3) {
                ppnVar17 = keymap;
              }
              else {
                ppnVar17 = unknown_keymap;
              }
              ppnVar17[uVar7 & 0x1ff] = pnVar13;
            }
          }
        }
LAB_0010b0de:
        pbVar11 = (byte *)strtok((char *)0x0,"\r\n");
      }
      free(__s);
    }
  }
  return;
}

Assistant:

void load_keymap(void)
{
    struct nh_cmd_desc *cmdlist = nh_get_commands(&cmdcount);
    
    commandlist = malloc(cmdcount * sizeof(struct nh_cmd_desc));
    memcpy(commandlist, cmdlist, cmdcount * sizeof(struct nh_cmd_desc));

    /* always init the keymap - read keymap might not set up every mapping */
    init_keymap();
    read_keymap();
}